

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

int luv_getaddrinfo(lua_State *L)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *service;
  lua_Integer lVar6;
  uv_getaddrinfo_t *req;
  luv_req_t *plVar7;
  uv_loop_t *loop;
  char *pcVar8;
  code *cb;
  addrinfo *hints;
  addrinfo hints_s;
  addrinfo local_60;
  
  iVar2 = lua_type(L,1);
  if (iVar2 < 1) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = luaL_checklstring(L,1,(size_t *)0x0);
  }
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    service = (char *)0x0;
  }
  else {
    service = luaL_checklstring(L,2,(size_t *)0x0);
  }
  iVar2 = lua_type(L,3);
  if (iVar2 < 1) {
    hints = (addrinfo *)0x0;
  }
  else {
    luaL_checktype(L,3,5);
    hints = &local_60;
  }
  if (hints == (addrinfo *)0x0) goto LAB_0014d4f1;
  hints->ai_canonname = (char *)0x0;
  hints->ai_next = (addrinfo *)0x0;
  *(undefined8 *)&hints->ai_addrlen = 0;
  hints->ai_addr = (sockaddr *)0x0;
  hints->ai_flags = 0;
  hints->ai_family = 0;
  hints->ai_socktype = 0;
  hints->ai_protocol = 0;
  lua_getfield(L,3,"family");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 == 0) {
      iVar2 = lua_type(L,-1);
      if (iVar2 == 0) {
        hints->ai_family = 0;
      }
      else {
        luaL_argerror(L,3,"family hint must be string if set");
      }
    }
    else {
      pcVar8 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar2 = luv_af_string_to_num(pcVar8);
      hints->ai_family = iVar2;
    }
  }
  else {
    lVar6 = lua_tointegerx(L,-1,(int *)0x0);
    hints->ai_family = (int)lVar6;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"socktype");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 != 0) {
      iVar2 = 0;
      pcVar8 = lua_tolstring(L,-1,(size_t *)0x0);
      if (pcVar8 != (char *)0x0) {
        iVar2 = strcmp(pcVar8,"stream");
        if (iVar2 == 0) {
          iVar2 = 1;
        }
        else {
          iVar2 = strcmp(pcVar8,"dgram");
          if (iVar2 == 0) {
            iVar2 = 2;
          }
          else {
            iVar2 = strcmp(pcVar8,"seqpacket");
            if (iVar2 == 0) {
              iVar2 = 5;
            }
            else {
              iVar2 = strcmp(pcVar8,"raw");
              if (iVar2 == 0) {
                iVar2 = 3;
              }
              else {
                iVar2 = strcmp(pcVar8,"rdm");
                iVar2 = (uint)(iVar2 == 0) << 2;
              }
            }
          }
        }
      }
      goto LAB_0014d2ff;
    }
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      pcVar5 = "socktype hint must be string if set";
      goto LAB_0014d6db;
    }
  }
  else {
    lVar6 = lua_tointegerx(L,-1,(int *)0x0);
    iVar2 = (int)lVar6;
LAB_0014d2ff:
    hints->ai_socktype = iVar2;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"protocol");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 == 0) {
      iVar2 = lua_type(L,-1);
      if (iVar2 != 0) {
        pcVar5 = "protocol hint must be string if set";
LAB_0014d6db:
        iVar2 = luaL_argerror(L,3,pcVar5);
        return iVar2;
      }
    }
    else {
      pcVar8 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar2 = luv_af_string_to_num(pcVar8);
      if (iVar2 == 0) {
        uVar4 = luaL_argerror(L,3,"Invalid protocol hint");
        pcVar8 = (char *)(ulong)uVar4;
      }
      else {
        hints->ai_protocol = iVar2;
        pcVar8 = pcVar5;
      }
      if (iVar2 == 0) {
        return (int)pcVar8;
      }
    }
  }
  else {
    lVar6 = lua_tointegerx(L,-1,(int *)0x0);
    hints->ai_protocol = (int)lVar6;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"addrconfig");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 0x20;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"v4mapped");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 8;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"all");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 0x10;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numerichost");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 4;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"passive");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 1;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numericserv");
  iVar2 = lua_toboolean(L,-1);
  if ((iVar2 != 0) &&
     (pbVar1 = (byte *)((long)&hints->ai_flags + 1), *pbVar1 = *pbVar1 | 4, service == (char *)0x0))
  {
    service = "00";
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"canonname");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    *(byte *)&hints->ai_flags = (byte)hints->ai_flags | 2;
  }
  lua_settop(L,-2);
LAB_0014d4f1:
  iVar2 = luv_check_continuation(L,4);
  req = (uv_getaddrinfo_t *)lua_newuserdata(L,0xa0);
  plVar7 = luv_setup_req(L,iVar2);
  req->data = plVar7;
  loop = luv_loop(L);
  cb = (uv_getaddrinfo_cb)0x0;
  if (iVar2 != -2) {
    cb = luv_getaddrinfo_cb;
  }
  iVar3 = uv_getaddrinfo(loop,req,cb,pcVar5,service,hints);
  if (iVar3 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar3);
    iVar3 = 3;
  }
  else {
    iVar3 = 1;
    if (iVar2 == -2) {
      lua_settop(L,-2);
      luv_pushaddrinfo(L,req->addrinfo);
      uv_freeaddrinfo(req->addrinfo);
      luv_cleanup_req(L,(luv_req_t *)req->data);
    }
  }
  return iVar3;
}

Assistant:

static int luv_getaddrinfo(lua_State* L) {
  uv_getaddrinfo_t* req;
  const char* node;
  const char* service;
  struct addrinfo hints_s;
  struct addrinfo* hints = &hints_s;
  int ret, ref;
  luv_ctx_t* ctx = luv_context(L);
  if (lua_isnoneornil(L, 1)) node = NULL;
  else node = luaL_checkstring(L, 1);
  if (lua_isnoneornil(L, 2)) service = NULL;
  else service = luaL_checkstring(L, 2);
  if (!lua_isnoneornil(L, 3)) luaL_checktype(L, 3, LUA_TTABLE);
  else hints = NULL;
  if (hints) {
    // Initialize the hints
    memset(hints, 0, sizeof(*hints));

    // Process the `family` hint.
    lua_getfield(L, 3, "family");
    if (lua_isnumber(L, -1)) {
      hints->ai_family = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_family = luv_af_string_to_num(lua_tostring(L, -1));
    }
    else if (lua_isnil(L, -1)) {
      hints->ai_family = AF_UNSPEC;
    }
    else {
      luaL_argerror(L, 3, "family hint must be string if set");
    }
    lua_pop(L, 1);

    // Process `socktype` hint
    lua_getfield(L, 3, "socktype");
    if (lua_isnumber(L, -1)) {
      hints->ai_socktype = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_socktype = luv_sock_string_to_num(lua_tostring(L, -1));
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "socktype hint must be string if set");
    }
    lua_pop(L, 1);

    // Process the `protocol` hint
    lua_getfield(L, 3, "protocol");
    if (lua_isnumber(L, -1)) {
      hints->ai_protocol = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      int protocol = luv_af_string_to_num(lua_tostring(L, -1));
      if (protocol) {
        hints->ai_protocol = protocol;
      }
      else {
        return luaL_argerror(L, 3, "Invalid protocol hint");
      }
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "protocol hint must be string if set");
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "addrconfig");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ADDRCONFIG;
    lua_pop(L, 1);

#ifdef AI_V4MAPPED
    lua_getfield(L, 3, "v4mapped");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_V4MAPPED;
    lua_pop(L, 1);
#endif

#ifdef AI_ALL
    lua_getfield(L, 3, "all");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ALL;
    lua_pop(L, 1);
#endif

    lua_getfield(L, 3, "numerichost");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_NUMERICHOST;
    lua_pop(L, 1);

    lua_getfield(L, 3, "passive");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_PASSIVE;
    lua_pop(L, 1);

    lua_getfield(L, 3, "numericserv");
    if (lua_toboolean(L, -1)) {
        hints->ai_flags |=  AI_NUMERICSERV;
        /* On OS X upto at least OSX 10.9, getaddrinfo crashes
         * if AI_NUMERICSERV is set and the servname is NULL or "0".
         * This workaround avoids a segfault in libsystem.
         */
        if (NULL == service) service = "00";
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "canonname");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_CANONNAME;
    lua_pop(L, 1);
  }

  ref = luv_check_continuation(L, 4);
  req = (uv_getaddrinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getaddrinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getaddrinfo_cb, node, service, hints);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {

    lua_pop(L, 1);
    luv_pushaddrinfo(L, req->addrinfo);
    uv_freeaddrinfo(req->addrinfo);
    luv_cleanup_req(L, (luv_req_t*)req->data);
  }
  return 1;
}